

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SecondaryOperationalData *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SecondaryOperationalData *local_18;
  SecondaryOperationalData *this_local;
  
  local_18 = this;
  this_local = (SecondaryOperationalData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"SecondaryOperationalData:");
  poVar1 = std::operator<<(poVar1,"\n\tParameter 1:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Param1);
  poVar1 = std::operator<<(poVar1,"\n\tParameter 2:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Param2);
  poVar1 = std::operator<<(poVar1,"\n\tNumber Fundamental Param Sets: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumFundParamSets);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SecondaryOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "SecondaryOperationalData:"
       << "\n\tParameter 1:                   " << ( KUINT16 )m_ui8Param1
       << "\n\tParameter 2:                   " << ( KUINT16 )m_ui8Param2
       << "\n\tNumber Fundamental Param Sets: " << m_ui16NumFundParamSets
       << "\n";

    return ss.str();
}